

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prometheus.cc
# Opt level: O0

void __thiscall
instrumentation::anon_unknown_0::prom_collector::write_<double>
          (prom_collector *this,metric_name *name,tags *t,double *v,char *metric_type)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  ostream *poVar5;
  char *local_c8;
  undefined1 local_50 [8];
  string pm_name;
  char *metric_type_local;
  double *v_local;
  tags *t_local;
  metric_name *name_local;
  prom_collector *this_local;
  
  pm_name.field_2._8_8_ = metric_type;
  (anonymous_namespace)::prom_collector::prom_metric_name_abi_cxx11_
            ((string *)local_50,(prom_collector *)name,(metric_name *)t);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->pending_help);
  if (bVar1) {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator->(&this->pending_help);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      poVar5 = std::operator<<(this->out,"# HELP ");
      poVar5 = std::operator<<(poVar5,(string *)local_50);
      poVar5 = std::operator<<(poVar5," ");
      pbVar4 = std::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&this->pending_help);
      poVar5 = std::operator<<(poVar5,(string *)pbVar4);
      std::operator<<(poVar5,"\n");
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::reset(&this->pending_help);
    poVar5 = std::operator<<(this->out,"# TYPE ");
    poVar5 = std::operator<<(poVar5,(string *)local_50);
    poVar5 = std::operator<<(poVar5," ");
    poVar5 = std::operator<<(poVar5,(char *)pm_name.field_2._8_8_);
    std::operator<<(poVar5,"\n");
  }
  poVar5 = std::operator<<(this->out,(string *)local_50);
  std::operator<<(poVar5,"\t");
  write_tags_(this,t);
  uVar2 = std::isnan(*v);
  if ((uVar2 & 1) == 0) {
    uVar2 = std::isinf(*v);
    if ((uVar2 & 1) == 0) {
      std::ostream::operator<<(this->out,*v);
    }
    else {
      if (0.0 < *v || *v == 0.0) {
        local_c8 = "+Inf";
      }
      else {
        local_c8 = "-Inf";
      }
      std::operator<<(this->out,local_c8);
    }
  }
  else {
    std::operator<<(this->out,"\"NaN\"");
  }
  std::operator<<(this->out,"\n");
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void write_(const metric_name& name, const tags& t, const T& v, const char* metric_type = "untyped") {
    const auto pm_name = prom_metric_name(name);

    if (pending_help) {
      if (!pending_help->empty())
        out << "# HELP " << pm_name << " " << *pending_help << "\n";
      pending_help.reset();
      out << "# TYPE " << pm_name << " " << metric_type << "\n";
    }

    out << pm_name << "\t";
    write_tags_(t);

    if constexpr(std::is_floating_point_v<T>) {
      // For floating point, ensure we handle the edge cases correctly.
      if (std::isnan(v)) {
        out << R"("NaN")";
      } else if (std::isinf(v)) {
        out << (v < 0 ? R"(-Inf)" : R"(+Inf)");
      } else {
        out << v;
      }
    } else {
      out << v;
    }

    out << "\n";
  }